

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_edit.cc
# Opt level: O2

void rcg::anon_unknown_0::redraw
               (vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                *list,int *top_row,int focus_row,char *message)

{
  pointer pNVar1;
  int iVar2;
  char *str;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  gcstring local_80 [80];
  
  if (_stdscr == 0) {
    iVar4 = -1;
  }
  else {
    iVar4 = *(short *)(_stdscr + 4) + 1;
  }
  erase();
  if (1 < iVar4) {
    iVar5 = *top_row;
    iVar2 = iVar5;
    if (focus_row <= iVar5) {
      iVar2 = focus_row;
    }
    iVar3 = iVar2 + -1 + iVar4;
    if ((focus_row < iVar5) || (iVar3 <= focus_row)) {
      if (iVar3 <= focus_row) {
        iVar2 = (focus_row + 2) - iVar4;
      }
      *top_row = iVar2;
    }
    for (lVar6 = 0; iVar5 = (int)lVar6, iVar4 + -1 != iVar5; lVar6 = lVar6 + 1) {
      iVar2 = *top_row;
      pNVar1 = (list->
               super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (iVar2 + iVar5 <
          (int)((ulong)((long)(list->
                              super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 4)) {
        redraw_line(iVar5,pNVar1 + iVar2 + lVar6,focus_row - iVar2 == iVar5,
                    SUB41(focus_row - iVar2,0));
      }
    }
    if ((message != (char *)0x0) && (*message != '\0')) {
      mvaddstr_eol(iVar4 + -1,0,message,true);
      return;
    }
    (**(code **)(*(long *)(list->
                          super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                          )._M_impl.super__Vector_impl_data._M_start[focus_row].node + 0x58))
              (local_80);
    str = (char *)GenICam_3_4::gcstring::c_str();
    mvaddstr_eol(iVar4 + -1,0,str,true);
    GenICam_3_4::gcstring::~gcstring(local_80);
  }
  return;
}

Assistant:

void redraw(std::vector<NodeParam> &list, int &top_row, int focus_row, const char *message=0)
{
  int rows=getmaxy(stdscr);

  erase();

  if (rows > 1)
  {
    rows--; // last row is used for showing tool tips and errors

    // focus row must always be visible

    if (focus_row < top_row) top_row=focus_row;
    if (focus_row > top_row+rows-1) top_row=focus_row-rows+1;

    // print all visible rows

    for (int i=0; i<rows; i++)
    {
      if (top_row+i < static_cast<int>(list.size()))
      {
        redraw_line(i, list[top_row+i], focus_row == top_row+i);
      }
    }

    if (message && *message != '\0')
    {
      mvaddstr_eol(rows, 0, message, true);
    }
    else
    {
      list[focus_row].printTooltip(rows, true);
    }
  }
}